

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O1

void __thiscall
(anonymous_namespace)::ResizeRealtimeTest_TestInternalResizeSetScaleMode3_Test::
~ResizeRealtimeTest_TestInternalResizeSetScaleMode3_Test
          (ResizeRealtimeTest_TestInternalResizeSetScaleMode3_Test *this)

{
  anon_unknown.dwarf_19f5211::ResizeRealtimeTest::~ResizeRealtimeTest
            ((ResizeRealtimeTest *)(this + -0x18));
  operator_delete((ResizeRealtimeTest *)(this + -0x18));
  return;
}

Assistant:

TEST_P(ResizeRealtimeTest, TestInternalResizeSetScaleMode3) {
  ::libaom_test::Y4mVideoSource video("niklas_1280_720_30.y4m", 0, 60);
  cfg_.g_w = 1280;
  cfg_.g_h = 720;
  set_scale_mode_ = false;
  set_scale_mode2_ = false;
  set_scale_mode3_ = true;
  DefaultConfig();
  change_bitrate_ = false;
  mismatch_nframes_ = 0;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
#if CONFIG_AV1_DECODER
  // Check we decoded the same number of frames as we attempted to encode
  ASSERT_EQ(frame_info_list_.size(), video.limit());
  for (const auto &info : frame_info_list_) {
    const auto frame = static_cast<unsigned>(info.pts);
    unsigned int expected_w = 640;
    unsigned int expected_h = 720;
    if (frame > 30) {
      expected_w = 1280;
      expected_h = 720;
    }
    EXPECT_EQ(expected_w, info.w)
        << "Frame " << frame << " had unexpected width";
    EXPECT_EQ(expected_h, info.h)
        << "Frame " << frame << " had unexpected height";
    EXPECT_EQ(static_cast<unsigned int>(0), GetMismatchFrames());
  }
#else
  printf("Warning: AV1 decoder unavailable, unable to check resize count!\n");
#endif
}